

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O1

DisasJumpType op_vfma(DisasContext_conflict13 *s,DisasOps *o)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  TCGContext_conflict12 *tcg_ctx;
  code *fn;
  code *pcVar5;
  bool bVar6;
  
  uVar1 = (s->fields).presentO;
  if (((uVar1 & 0x40) != 0) && ((char)uVar1 < '\0')) {
    uVar2 = (s->fields).c[4];
    if ((uVar2 & 7) != 0 || (char)(s->fields).c[5] != '\x03') {
      gen_program_exception(s,6);
      return DISAS_NORETURN;
    }
    bVar6 = (uVar2 & 8) == 0;
    pcVar5 = gen_helper_gvec_vfma64s;
    if (bVar6) {
      pcVar5 = gen_helper_gvec_vfma64;
    }
    fn = gen_helper_gvec_vfms64s;
    if (bVar6) {
      fn = gen_helper_gvec_vfms64;
    }
    if ((s->fields).field_0x9 == -0x71) {
      fn = pcVar5;
    }
    if ((uVar1 >> 0x16 & 1) != 0) {
      uVar2 = (s->fields).c[0];
      if ((uVar2 & 0xe0) == 0) {
        if ((uVar1 >> 0x17 & 1) == 0) goto LAB_00cdbfab;
        uVar3 = (s->fields).c[6];
        if ((uVar3 & 0xe0) == 0) {
          if ((uVar1 >> 0x18 & 1) == 0) goto LAB_00cdbfab;
          uVar4 = (s->fields).c[2];
          if ((uVar4 & 0xe0) == 0) {
            if ((uVar1 >> 0x19 & 1) == 0) goto LAB_00cdbfab;
            uVar1 = (s->fields).c[3];
            if ((uVar1 & 0xe0) == 0) {
              tcg_ctx = s->uc->tcg_ctx;
              tcg_gen_gvec_4_ptr_s390x
                        (tcg_ctx,(uVar2 & 0x1f) * 0x10 + 0x80,(uVar3 & 0x1f) * 0x10 + 0x80,
                         (uVar4 & 0x1f) * 0x10 + 0x80,(uVar1 & 0x1f) * 0x10 + 0x80,tcg_ctx->cpu_env,
                         0x10,0x10,0,fn);
              return DISAS_NEXT;
            }
          }
        }
      }
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                 ,0xdf,"reg < 32");
    }
  }
LAB_00cdbfab:
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_vfma(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t m5 = get_field(s, m5);
    const uint8_t fpf = get_field(s, m6);
    const bool se = extract32(m5, 3, 1);
    gen_helper_gvec_4_ptr *fn;

    if (fpf != FPF_LONG || extract32(m5, 0, 3)) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    if (s->fields.op2 == 0x8f) {
        fn = se ? gen_helper_gvec_vfma64s : gen_helper_gvec_vfma64;
    } else {
        fn = se ? gen_helper_gvec_vfms64s : gen_helper_gvec_vfms64;
    }
    gen_gvec_4_ptr(tcg_ctx, get_field(s, v1), get_field(s, v2),
                   get_field(s, v3), get_field(s, v4), tcg_ctx->cpu_env,
                   0, fn);
    return DISAS_NEXT;
}